

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

shared_ptr<wallet::CWallet> __thiscall
wallet::CWallet::Create
          (CWallet *this,WalletContext *context,string *name,
          unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database,
          uint64_t wallet_creation_flags,bilingual_str *error,
          vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  size_type *psVar1;
  Handler *pHVar2;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  bilingual_str lhs;
  bilingual_str lhs_00;
  bilingual_str lhs_01;
  bilingual_str lhs_02;
  bilingual_str lhs_03;
  bilingual_str lhs_04;
  bilingual_str lhs_05;
  bilingual_str lhs_06;
  bilingual_str lhs_07;
  bilingual_str lhs_08;
  bilingual_str lhs_09;
  bilingual_str lhs_10;
  element_type *peVar3;
  size_type sVar4;
  char cVar5;
  bool bVar6;
  DBErrors DVar7;
  int iVar8;
  uint uVar9;
  ArgsManager **ppAVar10;
  long lVar11;
  CWallet *this_00;
  int64_t iVar12;
  undefined8 uVar13;
  _Rb_tree_node_base *p_Var14;
  optional<OutputType> oVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64_t iVar16;
  long lVar17;
  ArgsManager *pAVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint *args;
  string *psVar19;
  undefined4 uVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_29;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_32;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_33;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_34;
  _Storage<long,_true> _Var22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  _Alloc_hider _Var24;
  char *args_1;
  bilingual_str *args_2;
  ArgsManager *this_01;
  long in_FS_OFFSET;
  optional<long> oVar25;
  shared_ptr<wallet::CWallet> sVar26;
  optional<long> pay_tx_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock58;
  string max_aps_fee;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock59;
  ArgsManager *pAVar27;
  Chain *chain;
  undefined4 in_stack_fffffffffffffa80;
  undefined1 rescan_required;
  undefined4 in_stack_fffffffffffffa90;
  FeeEstimateMode in_stack_fffffffffffffa94;
  CFeeRate local_568;
  long *local_560;
  shared_ptr<wallet::CWallet> local_558;
  _Storage<long,_true> local_548;
  byte local_540;
  long *local_538 [2];
  long local_528 [2];
  bilingual_str local_518;
  bilingual_str local_4d8;
  string local_498;
  long *local_478 [2];
  long local_468 [2];
  bilingual_str local_458;
  bilingual_str local_418;
  long *local_3d8 [2];
  long local_3c8 [2];
  bilingual_str local_3b8;
  bilingual_str local_378;
  long *local_338 [2];
  long local_328 [2];
  bilingual_str local_318;
  bilingual_str local_2d8;
  long *local_298 [2];
  long local_288 [2];
  bilingual_str local_278;
  bilingual_str local_238;
  undefined1 local_1f8 [8];
  bool local_1f0 [8];
  __native_type local_1e8;
  long *local_1b8 [2];
  long local_1a8 [2];
  bilingual_str local_198;
  bilingual_str local_158;
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  bool local_d0 [8];
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  bilingual_str local_98;
  _Alloc_hider local_58 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  chain = context->chain;
  args_1 = "context.args";
  args_2 = error;
  ppAVar10 = inline_assertion_check<true,ArgsManager*&>
                       (&context->args,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                        ,0xb9f,"Create","context.args");
  pAVar27 = *ppAVar10;
  (**(code **)(**(long **)database._M_t.
                          super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                          .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl +
              0x60))(local_58);
  lVar11 = std::chrono::_V2::steady_clock::now();
  this_00 = (CWallet *)operator_new(0x4a8);
  local_560 = *(long **)database._M_t.
                        super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                        .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
  *(undefined8 *)
   database._M_t.
   super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>._M_t.
   super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>.
   super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl = 0;
  CWallet(this_00,chain,name,
          (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>)
          &local_560);
  local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<wallet::CWallet*,void(*)(wallet::CWallet*),std::allocator<void>,void>
            (&local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00,FlushAndDeleteWallet);
  if (local_560 != (long *)0x0) {
    (**(code **)(*local_560 + 8))();
  }
  local_560 = (long *)0x0;
  paVar23 = &local_98.original.field_2;
  local_98.original._M_dataplus._M_p = (pointer)paVar23;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-keypool","");
  this_01 = pAVar27;
  iVar12 = ArgsManager::GetIntArg(pAVar27,&local_98.original,1000);
  iVar16 = 1;
  if (1 < iVar12) {
    iVar16 = iVar12;
  }
  (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_keypool_size
       = iVar16;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.original._M_dataplus._M_p != paVar23) {
    operator_delete(local_98.original._M_dataplus._M_p,
                    local_98.original.field_2._M_allocated_capacity + 1);
  }
  local_d8 = (undefined1  [8])local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-walletnotify","");
  local_1f8 = (undefined1  [8])&local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
  ArgsManager::GetArg(&local_98.original,pAVar27,(string *)local_d8,(string *)local_1f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_notify_tx_changed_script,&local_98.original);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.original._M_dataplus._M_p != paVar23) {
    operator_delete(local_98.original._M_dataplus._M_p,
                    local_98.original.field_2._M_allocated_capacity + 1);
  }
  if (local_1f8 != (undefined1  [8])&local_1e8) {
    operator_delete((void *)local_1f8,local_1e8.__align + 1);
  }
  pAVar27 = this_01;
  if (local_d8 != (undefined1  [8])local_c8) {
    operator_delete((void *)local_d8,local_c8._0_8_ + 1);
  }
  DVar7 = LoadWallet(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  uVar20 = 0;
  args = &switchD_00c06b36::switchdataD_010e5998;
  switch(DVar7) {
  case LOAD_OK:
    goto switchD_00c06b36_caseD_0;
  case NEED_RESCAN:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,
               "Error reading %s! Transaction data may be missing or incorrect. Rescanning wallet.",
               "");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),
                 "Error reading %s! Transaction data may be missing or incorrect. Rescanning wallet."
                 ,"");
      this_01 = pAVar27;
    }
    else {
      local_1f8 = (undefined1  [8])0x10e7326;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
      this_01 = pAVar27;
    }
    pAVar27 = this_01;
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,&local_98);
    uVar13 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
      operator_delete(local_98.translated._M_dataplus._M_p,
                      local_98.translated.field_2._M_allocated_capacity + 1);
      uVar13 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
      uVar13 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._16_8_ != &local_a8) {
      operator_delete((void *)local_c8._16_8_,(ulong)(local_a8._M_allocated_capacity + 1));
      uVar13 = extraout_RDX_02;
    }
    if (local_d8 != (undefined1  [8])local_c8) {
      operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      uVar13 = extraout_RDX_03;
    }
    uVar20 = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),1);
    goto switchD_00c06b36_caseD_0;
  case NEED_REWRITE:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Wallet needed to be rewritten: restart %s to complete","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),"Wallet needed to be rewritten: restart %s to complete"
                 ,"");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e72f0;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<char[13]>(&local_98,(bilingual_str *)local_d8,(char (*) [13])"Bitcoin Core");
    break;
  case EXTERNAL_SIGNER_SUPPORT_REQUIRED:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,
               "Error loading %s: External signer wallet being loaded without external signer support compiled"
               ,"");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),
                 "Error loading %s: External signer wallet being loaded without external signer support compiled"
                 ,"");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e7291;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  case NONCRITICAL_ERROR:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,
               "Error reading %s! All keys read correctly, but transaction data or address metadata may be missing or incorrect."
               ,"");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),
                 "Error reading %s! All keys read correctly, but transaction data or address metadata may be missing or incorrect."
                 ,"");
      this_01 = pAVar27;
    }
    else {
      local_1f8 = (undefined1  [8])0x10e71ea;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
      this_01 = pAVar27;
    }
    pAVar27 = this_01;
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
      operator_delete(local_98.translated._M_dataplus._M_p,
                      local_98.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._16_8_ != &local_a8) {
      operator_delete((void *)local_c8._16_8_,(ulong)(local_a8._M_allocated_capacity + 1));
    }
    if (local_d8 != (undefined1  [8])local_c8) {
      operator_delete((void *)local_d8,local_c8._0_8_ + 1);
    }
    uVar20 = 0;
switchD_00c06b36_caseD_0:
    if (((((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) &&
        ((((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x100000000) == 0)) &&
       (args = (uint *)0x200000000,
       (((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x200000000) == 0)) {
      SetMinVersion(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    ,FEATURE_LATEST,(WalletBatch *)0x0);
      InitWalletFlags(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,wallet_creation_flags);
      if ((((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
        SetupLegacyScriptPubKeyMan
                  (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
      }
      if ((wallet_creation_flags >> 0x23 & 1) != 0 || (wallet_creation_flags & 0x300000000) == 0) {
        local_1f8 = (undefined1  [8])
                    &(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->cs_wallet;
        local_1f0[0] = false;
        std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_1f8)
        ;
        if ((((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x400000000) == 0) {
          GetActiveScriptPubKeyMans
                    ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                      *)local_d8,
                     local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          this_01 = pAVar27;
          for (p_Var14 = (_Rb_tree_node_base *)local_c8._8_8_;
              p_Var14 != (_Rb_tree_node_base *)local_d0;
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
            cVar5 = (**(code **)(**(long **)(p_Var14 + 1) + 0x58))(*(long **)(p_Var14 + 1),0);
            if (cVar5 == '\0') {
              local_98.original._M_dataplus._M_p = (pointer)paVar23;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"Unable to generate initial keys","");
              psVar19 = &local_98.translated;
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_98.translated._M_dataplus._M_p = (pointer)&local_98.translated.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)psVar19,"Unable to generate initial keys","");
              }
              else {
                local_f8._M_dataplus._M_p = "Unable to generate initial keys";
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          (psVar19,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_f8);
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->original,&local_98.original);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&error->translated,psVar19);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
                operator_delete(local_98.translated._M_dataplus._M_p,
                                local_98.translated.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98.original._M_dataplus._M_p != paVar23) {
                operator_delete(local_98.original._M_dataplus._M_p,
                                local_98.original.field_2._M_allocated_capacity + 1);
              }
              (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
              (this->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
              std::
              _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                           *)local_d8);
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)local_1f8);
              _Var21._M_pi = extraout_RDX_34;
              goto LAB_00c09b30;
            }
          }
          std::
          _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                       *)local_d8);
          pAVar27 = this_01;
        }
        else {
          SetupDescriptorScriptPubKeyMans
                    (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)local_1f8);
      }
      peVar3 = local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (chain != (Chain *)0x0) {
        (*chain->_vptr_Chain[5])(&local_98);
        chainStateFlushed(peVar3,NORMAL,(CBlockLocator *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98.original._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_98.original._M_dataplus._M_p,
                          local_98.original.field_2._M_allocated_capacity -
                          (long)local_98.original._M_dataplus._M_p);
        }
      }
    }
    else {
      if ((wallet_creation_flags & 0x100000000) != 0) {
        local_d8 = (undefined1  [8])local_c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,
                   "Error loading %s: Private keys can only be disabled during creation","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_c8._16_8_ = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_c8 + 0x10),
                     "Error loading %s: Private keys can only be disabled during creation","");
        }
        else {
          local_1f8 = (undefined1  [8])0x10e74b6;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8
                    );
        }
        tinyformat::format<std::__cxx11::string>
                  (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        break;
      }
      if ((((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x100000000) != 0) {
        GetActiveScriptPubKeyMans
                  ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                    *)local_1f8,
                   local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ;
        this_01 = pAVar27;
        for (uVar13 = local_1e8._8_8_;
            (_Rb_tree_node_base *)uVar13 != (_Rb_tree_node_base *)local_1f0;
            uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13)) {
          cVar5 = (**(code **)(**(long **)(uVar13 + 0x20) + 0x78))();
          if (cVar5 != '\0') {
            local_d8 = (undefined1  [8])local_c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,
                       "Warning: Private keys detected in wallet {%s} with disabled private keys",""
                      );
            if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0)
            {
              local_c8._16_8_ = &local_a8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)(local_c8 + 0x10),
                         "Warning: Private keys detected in wallet {%s} with disabled private keys",
                         "");
            }
            else {
              local_f8._M_dataplus._M_p =
                   "Warning: Private keys detected in wallet {%s} with disabled private keys";
              (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                         (char **)&local_f8);
            }
            tinyformat::format<std::__cxx11::string>
                      (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (warnings,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
              operator_delete(local_98.translated._M_dataplus._M_p,
                              local_98.translated.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98.original._M_dataplus._M_p != paVar23) {
              operator_delete(local_98.original._M_dataplus._M_p,
                              local_98.original.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._16_8_ != &local_a8) {
              operator_delete((void *)local_c8._16_8_,(ulong)(local_a8._M_allocated_capacity + 1));
            }
            if (local_d8 != (undefined1  [8])local_c8) {
              operator_delete((void *)local_d8,local_c8._0_8_ + 1);
            }
            break;
          }
        }
        std::
        _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                     *)local_1f8);
        pAVar27 = this_01;
      }
    }
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-addresstype","");
    local_1f8 = (undefined1  [8])&local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
    ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
    sVar4 = local_98.original._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])&local_1e8) {
      operator_delete((void *)local_1f8,local_1e8.__align + 1);
    }
    if (local_d8 != (undefined1  [8])local_c8) {
      operator_delete((void *)local_d8,local_c8._0_8_ + 1);
    }
    if (sVar4 != 0) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-addresstype","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar15 = ParseOutputType(&local_98.original);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (((ulong)oVar15.super__Optional_base<OutputType,_true,_true>._M_payload.
                  super__Optional_payload_base<OutputType> & 0x100000000) != 0) {
        (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_default_address_type =
             oVar15.super__Optional_base<OutputType,_true,_true>._M_payload.
             super__Optional_payload_base<OutputType>._M_payload;
        goto LAB_00c07255;
      }
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"Unknown address type \'%s\'","");
      if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
        local_c8._16_8_ = &local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_c8 + 0x10),"Unknown address type \'%s\'","");
      }
      else {
        local_1f8 = (undefined1  [8])0xfa9529;
        (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-addresstype","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      psVar19 = &local_118;
      ArgsManager::GetArg((string *)local_1f8,this_01,&local_f8,psVar19);
      tinyformat::format<std::__cxx11::string>
                (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_1f8,psVar19);
LAB_00c094bf:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_98.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_98.translated);
      _Var21._M_pi = extraout_RDX_16;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
        operator_delete(local_98.translated._M_dataplus._M_p,
                        local_98.translated.field_2._M_allocated_capacity + 1);
        _Var21._M_pi = extraout_RDX_17;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
        _Var21._M_pi = extraout_RDX_18;
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
        _Var21._M_pi = extraout_RDX_19;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        _Var21._M_pi = extraout_RDX_20;
      }
      local_98.original.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      _Var24._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00c09ae2;
      goto LAB_00c09aea;
    }
LAB_00c07255:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-changetype","");
    local_1f8 = (undefined1  [8])&local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
    ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8 != (undefined1  [8])&local_1e8) {
      operator_delete((void *)local_1f8,local_1e8.__align + 1);
    }
    if (local_d8 != (undefined1  [8])local_c8) {
      operator_delete((void *)local_d8,local_c8._0_8_ + 1);
    }
    if (local_98.original._M_string_length != 0) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-changetype","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar15 = ParseOutputType(&local_98.original);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (((ulong)oVar15.super__Optional_base<OutputType,_true,_true>._M_payload.
                  super__Optional_payload_base<OutputType> & 0x100000000) == 0) {
        local_d8 = (undefined1  [8])local_c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"Unknown change type \'%s\'","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_c8._16_8_ = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_c8 + 0x10),"Unknown change type \'%s\'","");
        }
        else {
          local_1f8 = (undefined1  [8])0x10e7543;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8
                    );
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-changetype","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        psVar19 = &local_118;
        ArgsManager::GetArg((string *)local_1f8,this_01,&local_f8,psVar19);
        tinyformat::format<std::__cxx11::string>
                  (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_1f8,psVar19);
        goto LAB_00c094bf;
      }
      ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_default_change_type).super__Optional_base<OutputType,_true,_true>._M_payload.
      super__Optional_payload_base<OutputType> =
           (_Optional_payload_base<OutputType>)
           ((ulong)oVar15.super__Optional_base<OutputType,_true,_true>._M_payload.
                   super__Optional_payload_base<OutputType> & 0x1ffffffff);
    }
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-mintxfee","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-mintxfee","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar25 = ParseMoney(&local_98.original);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (((undefined1  [16])
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (1000000 < oVar25.super__Optional_base<long,_true,_true>._M_payload.
                      super__Optional_payload_base<long>._M_payload) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-mintxfee","");
          common::AmountHighWarn(&local_198,&local_f8);
          local_1b8[0] = local_1a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8," ","");
          original._M_string_length = (size_type)error;
          original._M_dataplus._M_p = (pointer)pAVar27;
          original.field_2._M_allocated_capacity = (size_type)this;
          original.field_2._8_8_ = chain;
          Untranslated((bilingual_str *)local_d8,original);
          lhs.original._M_string_length = (size_type)error;
          lhs.original._M_dataplus._M_p = (pointer)pAVar27;
          lhs.original.field_2._M_allocated_capacity = (size_type)this;
          lhs.original.field_2._8_8_ = chain;
          lhs.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
          lhs.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
          lhs.translated._M_string_length._4_4_ = uVar20;
          lhs.translated.field_2._M_allocated_capacity = lVar11;
          lhs.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
          lhs.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
          operator+(&local_158,lhs,&local_198);
          _((bilingual_str *)local_1f8,(ConstevalStringLiteral)0x10e7566);
          lhs_00.original._M_string_length = (size_type)error;
          lhs_00.original._M_dataplus._M_p = (pointer)pAVar27;
          lhs_00.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_00.original.field_2._8_8_ = chain;
          lhs_00.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
          lhs_00.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
          lhs_00.translated._M_string_length._4_4_ = uVar20;
          lhs_00.translated.field_2._M_allocated_capacity = lVar11;
          lhs_00.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
          lhs_00.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
          operator+(&local_98,lhs_00,&local_158);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)local_1f8);
          bilingual_str::~bilingual_str(&local_158);
          bilingual_str::~bilingual_str((bilingual_str *)local_d8);
          this_01 = pAVar27;
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
            this_01 = pAVar27;
          }
          bilingual_str::~bilingual_str(&local_198);
          pAVar27 = this_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            (ulong)(local_f8.field_2._M_allocated_capacity + 1));
          }
        }
        ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_min_fee).nSatoshisPerK =
             oVar25.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        goto LAB_00c0768a;
      }
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"mintxfee","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-mintxfee","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      ArgsManager::GetArg((string *)local_1f8,this_01,&local_f8,&local_118);
      common::AmountErrMsg(&local_98,(string *)local_d8,(string *)local_1f8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_98.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_98.translated);
      _Var21._M_pi = extraout_RDX_07;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
        operator_delete(local_98.translated._M_dataplus._M_p,
                        local_98.translated.field_2._M_allocated_capacity + 1);
        _Var21._M_pi = extraout_RDX_08;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
        _Var21._M_pi = extraout_RDX_09;
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
        _Var21._M_pi = extraout_RDX_10;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        _Var21._M_pi = extraout_RDX_11;
      }
      local_a8._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
      _Var24._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00c09b03;
      goto LAB_00c09b0b;
    }
LAB_00c0768a:
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-maxapsfee","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_98.original._M_dataplus._M_p = (pointer)paVar23;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-maxapsfee","");
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
      ArgsManager::GetArg(&local_f8,this_01,&local_98.original,(string *)local_d8);
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_f8,"-1");
      if (iVar8 == 0) {
        _Var22._M_value = -1;
LAB_00c07915:
        (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_max_aps_fee = (CAmount)_Var22;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        goto LAB_00c07942;
      }
      oVar25 = ParseMoney(&local_f8);
      _Var22._M_value =
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      if (((undefined1  [16])
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (10000 < _Var22._M_value) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"-maxapsfee","");
          common::AmountHighWarn(&local_278,&local_118);
          local_298[0] = local_288;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298," ","");
          original_00._M_string_length = (size_type)error;
          original_00._M_dataplus._M_p = (pointer)pAVar27;
          original_00.field_2._M_allocated_capacity = (size_type)this;
          original_00.field_2._8_8_ = chain;
          Untranslated((bilingual_str *)local_d8,original_00);
          lhs_01.original._M_string_length = (size_type)error;
          lhs_01.original._M_dataplus._M_p = (pointer)pAVar27;
          lhs_01.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_01.original.field_2._8_8_ = chain;
          lhs_01.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
          lhs_01.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
          lhs_01.translated._M_string_length._4_4_ = uVar20;
          lhs_01.translated.field_2._M_allocated_capacity = lVar11;
          lhs_01.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
          lhs_01.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
          operator+(&local_238,lhs_01,&local_278);
          _((bilingual_str *)local_1f8,(ConstevalStringLiteral)0x10e75b3);
          lhs_02.original._M_string_length = (size_type)error;
          lhs_02.original._M_dataplus._M_p = (pointer)pAVar27;
          lhs_02.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_02.original.field_2._8_8_ = chain;
          lhs_02.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
          lhs_02.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
          lhs_02.translated._M_string_length._4_4_ = uVar20;
          lhs_02.translated.field_2._M_allocated_capacity = lVar11;
          lhs_02.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
          lhs_02.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
          operator+(&local_98,lhs_02,&local_238);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)local_1f8);
          bilingual_str::~bilingual_str(&local_238);
          bilingual_str::~bilingual_str((bilingual_str *)local_d8);
          this_01 = pAVar27;
          if (local_298[0] != local_288) {
            operator_delete(local_298[0],local_288[0] + 1);
            this_01 = pAVar27;
          }
          bilingual_str::~bilingual_str(&local_278);
          pAVar27 = this_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        goto LAB_00c07915;
      }
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"maxapsfee","");
      common::AmountErrMsg(&local_98,(string *)local_d8,&local_f8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_98.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_98.translated);
      bilingual_str::~bilingual_str(&local_98);
      _Var21._M_pi = extraout_RDX_21;
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
        _Var21._M_pi = extraout_RDX_22;
      }
      (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
      (this->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        _Var21._M_pi = extraout_RDX_23;
      }
      goto LAB_00c09b30;
    }
LAB_00c07942:
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-fallbackfee","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-fallbackfee","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar25 = ParseMoney(&local_98.original);
      _Var22._M_value =
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (((undefined1  [16])
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (1000000 < _Var22._M_value) {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-fallbackfee","");
          common::AmountHighWarn(&local_318,&local_f8);
          local_338[0] = local_328;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_338," ","");
          original_01._M_string_length = (size_type)error;
          original_01._M_dataplus._M_p = (pointer)pAVar27;
          original_01.field_2._M_allocated_capacity = (size_type)this;
          original_01.field_2._8_8_ = chain;
          Untranslated((bilingual_str *)local_d8,original_01);
          lhs_03.original._M_string_length = (size_type)error;
          lhs_03.original._M_dataplus._M_p = (pointer)pAVar27;
          lhs_03.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_03.original.field_2._8_8_ = chain;
          lhs_03.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
          lhs_03.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
          lhs_03.translated._M_string_length._4_4_ = uVar20;
          lhs_03.translated.field_2._M_allocated_capacity = lVar11;
          lhs_03.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
          lhs_03.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
          operator+(&local_2d8,lhs_03,&local_318);
          _((bilingual_str *)local_1f8,(ConstevalStringLiteral)0x10e7667);
          lhs_04.original._M_string_length = (size_type)error;
          lhs_04.original._M_dataplus._M_p = (pointer)pAVar27;
          lhs_04.original.field_2._M_allocated_capacity = (size_type)this;
          lhs_04.original.field_2._8_8_ = chain;
          lhs_04.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
          lhs_04.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
          lhs_04.translated._M_string_length._4_4_ = uVar20;
          lhs_04.translated.field_2._M_allocated_capacity = lVar11;
          lhs_04.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
          lhs_04.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
          operator+(&local_98,lhs_04,&local_2d8);
          std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                    (warnings,&local_98);
          bilingual_str::~bilingual_str(&local_98);
          bilingual_str::~bilingual_str((bilingual_str *)local_1f8);
          bilingual_str::~bilingual_str(&local_2d8);
          bilingual_str::~bilingual_str((bilingual_str *)local_d8);
          this_01 = pAVar27;
          if (local_338[0] != local_328) {
            operator_delete(local_338[0],local_328[0] + 1);
            this_01 = pAVar27;
          }
          bilingual_str::~bilingual_str(&local_318);
          pAVar27 = this_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            (ulong)(local_f8.field_2._M_allocated_capacity + 1));
          }
        }
        ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_fallback_fee).nSatoshisPerK = (CAmount)_Var22;
        goto LAB_00c07be4;
      }
      _((bilingual_str *)local_d8,(ConstevalStringLiteral)0x10e7642);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-fallbackfee","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
      tinyformat::format<char[13],std::__cxx11::string>
                (&local_98,(tinyformat *)local_d8,(bilingual_str *)"-fallbackfee",
                 (char (*) [13])local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
LAB_00c08d25:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_98.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_98.translated);
      bilingual_str::~bilingual_str(&local_98);
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00c08d9e:
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
LAB_00c08dae:
      bilingual_str::~bilingual_str((bilingual_str *)local_d8);
      _Var21._M_pi = extraout_RDX_12;
      goto LAB_00c09b28;
    }
    _Var22 = (_Storage<long,_true>)
             ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_fallback_fee).nSatoshisPerK;
LAB_00c07be4:
    (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_allow_fallback_fee = _Var22._M_value != 0;
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-discardfee","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-discardfee","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar25 = ParseMoney(&local_98.original);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (((undefined1  [16])
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        _((bilingual_str *)local_d8,(ConstevalStringLiteral)0x10e7642);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-discardfee","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
        tinyformat::format<char[12],std::__cxx11::string>
                  (&local_98,(tinyformat *)local_d8,(bilingual_str *)"-discardfee",
                   (char (*) [12])local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
        goto LAB_00c08d25;
      }
      if (1000000 < oVar25.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_payload) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-discardfee","");
        common::AmountHighWarn(&local_3b8,&local_f8);
        local_3d8[0] = local_3c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8," ","");
        original_02._M_string_length = (size_type)error;
        original_02._M_dataplus._M_p = (pointer)pAVar27;
        original_02.field_2._M_allocated_capacity = (size_type)this;
        original_02.field_2._8_8_ = chain;
        Untranslated((bilingual_str *)local_d8,original_02);
        lhs_05.original._M_string_length = (size_type)error;
        lhs_05.original._M_dataplus._M_p = (pointer)pAVar27;
        lhs_05.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_05.original.field_2._8_8_ = chain;
        lhs_05.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
        lhs_05.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
        lhs_05.translated._M_string_length._4_4_ = uVar20;
        lhs_05.translated.field_2._M_allocated_capacity = lVar11;
        lhs_05.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
        lhs_05.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
        operator+(&local_378,lhs_05,&local_3b8);
        _((bilingual_str *)local_1f8,(ConstevalStringLiteral)0x10e76c1);
        lhs_06.original._M_string_length = (size_type)error;
        lhs_06.original._M_dataplus._M_p = (pointer)pAVar27;
        lhs_06.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_06.original.field_2._8_8_ = chain;
        lhs_06.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
        lhs_06.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
        lhs_06.translated._M_string_length._4_4_ = uVar20;
        lhs_06.translated.field_2._M_allocated_capacity = lVar11;
        lhs_06.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
        lhs_06.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
        operator+(&local_98,lhs_06,&local_378);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (warnings,&local_98);
        bilingual_str::~bilingual_str(&local_98);
        bilingual_str::~bilingual_str((bilingual_str *)local_1f8);
        bilingual_str::~bilingual_str(&local_378);
        bilingual_str::~bilingual_str((bilingual_str *)local_d8);
        this_01 = pAVar27;
        if (local_3d8[0] != local_3c8) {
          operator_delete(local_3d8[0],local_3c8[0] + 1);
          this_01 = pAVar27;
        }
        bilingual_str::~bilingual_str(&local_3b8);
        pAVar27 = this_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
      }
      ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_discard_rate).nSatoshisPerK =
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-paytxfee","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-paytxfee","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar25 = ParseMoney(&local_98.original);
      local_548._M_value =
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_540 = oVar25.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (local_540 == 0) {
        local_d8 = (undefined1  [8])local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"paytxfee","");
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-paytxfee","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
        common::AmountErrMsg(&local_98,(string *)local_d8,(string *)local_1f8);
LAB_00c08fbc:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,&local_98.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,&local_98.translated);
        bilingual_str::~bilingual_str(&local_98);
        _Var21._M_pi = extraout_RDX_13;
        if (local_1f8 != (undefined1  [8])&local_1e8) {
          operator_delete((void *)local_1f8,local_1e8.__align + 1);
          _Var21._M_pi = extraout_RDX_14;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          _Var21._M_pi = extraout_RDX_15;
        }
        local_a8._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
        _Var24._M_p = local_f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00c09b03;
        goto LAB_00c09b0b;
      }
      if (1000000 < local_548._M_value) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-paytxfee","");
        common::AmountHighWarn(&local_458,&local_f8);
        local_478[0] = local_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_478," ","");
        original_03._M_string_length = (size_type)error;
        original_03._M_dataplus._M_p = (pointer)pAVar27;
        original_03.field_2._M_allocated_capacity = (size_type)this;
        original_03.field_2._8_8_ = chain;
        Untranslated((bilingual_str *)local_d8,original_03);
        lhs_07.original._M_string_length = (size_type)error;
        lhs_07.original._M_dataplus._M_p = (pointer)pAVar27;
        lhs_07.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_07.original.field_2._8_8_ = chain;
        lhs_07.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
        lhs_07.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
        lhs_07.translated._M_string_length._4_4_ = uVar20;
        lhs_07.translated.field_2._M_allocated_capacity = lVar11;
        lhs_07.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
        lhs_07.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
        operator+(&local_418,lhs_07,&local_458);
        _((bilingual_str *)local_1f8,(ConstevalStringLiteral)0x10e7724);
        lhs_08.original._M_string_length = (size_type)error;
        lhs_08.original._M_dataplus._M_p = (pointer)pAVar27;
        lhs_08.original.field_2._M_allocated_capacity = (size_type)this;
        lhs_08.original.field_2._8_8_ = chain;
        lhs_08.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
        lhs_08.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
        lhs_08.translated._M_string_length._4_4_ = uVar20;
        lhs_08.translated.field_2._M_allocated_capacity = lVar11;
        lhs_08.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
        lhs_08.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
        operator+(&local_98,lhs_08,&local_418);
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (warnings,&local_98);
        bilingual_str::~bilingual_str(&local_98);
        bilingual_str::~bilingual_str((bilingual_str *)local_1f8);
        bilingual_str::~bilingual_str(&local_418);
        bilingual_str::~bilingual_str((bilingual_str *)local_d8);
        this_01 = pAVar27;
        if (local_478[0] != local_468) {
          operator_delete(local_478[0],local_468[0] + 1);
          this_01 = pAVar27;
        }
        bilingual_str::~bilingual_str(&local_458);
        pAVar27 = this_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
      }
      if ((local_540 & 1) == 0) {
        if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
          std::__throw_bad_optional_access();
        }
        goto LAB_00c0abcc;
      }
      CFeeRate::CFeeRate((CFeeRate *)&local_98,&local_548._M_value,1000);
      peVar3 = local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_pay_tx_fee).nSatoshisPerK = (CAmount)local_98.original._M_dataplus._M_p;
      if ((chain == (Chain *)0x0) ||
         (iVar8 = (*chain->_vptr_Chain[0x1e])(),
         CONCAT44(extraout_var,iVar8) <= (peVar3->m_pay_tx_fee).nSatoshisPerK)) goto LAB_00c0816b;
      _((bilingual_str *)local_d8,(ConstevalStringLiteral)0x10e7768);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-paytxfee","");
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
      ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
      iVar8 = (*chain->_vptr_Chain[0x1e])();
      local_568.nSatoshisPerK = CONCAT44(extraout_var_02,iVar8);
      CFeeRate::ToString_abi_cxx11_
                (&local_498,&local_568,(FeeEstimateMode *)&stack0xfffffffffffffa94);
      tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                (&local_98,(tinyformat *)local_d8,(bilingual_str *)"-paytxfee",
                 (char (*) [10])local_1f8,&local_498,&args_2->original);
LAB_00c09817:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_98.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_98.translated);
      bilingual_str::~bilingual_str(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00c08d9e;
      goto LAB_00c08dae;
    }
LAB_00c0816b:
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-maxtxfee","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-maxtxfee","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar25 = ParseMoney(&local_98.original);
      local_548._M_value =
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_540 = oVar25.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_engaged;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (local_540 == 0) {
        local_d8 = (undefined1  [8])local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"maxtxfee","");
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-maxtxfee","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
        common::AmountErrMsg(&local_98,(string *)local_d8,(string *)local_1f8);
        goto LAB_00c08fbc;
      }
      if (100000000 < local_548._M_value) {
        _((bilingual_str *)local_d8,(ConstevalStringLiteral)0x10e77ad);
        tinyformat::format<char[10]>(&local_98,(bilingual_str *)local_d8,(char (*) [10])"-maxtxfee")
        ;
        std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                  (warnings,&local_98);
        bilingual_str::~bilingual_str(&local_98);
        bilingual_str::~bilingual_str((bilingual_str *)local_d8);
      }
      if (chain != (Chain *)0x0) {
        if (local_540 == 0) {
          if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
            std::__throw_bad_optional_access();
          }
          goto LAB_00c0abcc;
        }
        CFeeRate::CFeeRate((CFeeRate *)&local_98,&local_548._M_value,1000);
        iVar8 = (*chain->_vptr_Chain[0x1e])();
        if ((long)local_98.original._M_dataplus._M_p < CONCAT44(extraout_var_00,iVar8)) {
          _((bilingual_str *)local_d8,(ConstevalStringLiteral)0x10e77f9);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-maxtxfee","");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
          ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
          iVar8 = (*chain->_vptr_Chain[0x1e])();
          local_568.nSatoshisPerK = CONCAT44(extraout_var_03,iVar8);
          CFeeRate::ToString_abi_cxx11_
                    (&local_498,&local_568,(FeeEstimateMode *)&stack0xfffffffffffffa94);
          tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                    (&local_98,(tinyformat *)local_d8,(bilingual_str *)"-maxtxfee",
                     (char (*) [10])local_1f8,&local_498,&args_2->original);
          goto LAB_00c09817;
        }
      }
      if (local_540 == 0) {
        if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
          std::__throw_bad_optional_access();
        }
        goto LAB_00c0abcc;
      }
      (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_default_max_tx_fee = (CAmount)local_548;
    }
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-consolidatefeerate","");
    bVar6 = ArgsManager::IsArgSet(this_01,&local_98.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      local_d8 = (undefined1  [8])local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-consolidatefeerate","");
      local_1f8 = (undefined1  [8])&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"");
      ArgsManager::GetArg(&local_98.original,this_01,(string *)local_d8,(string *)local_1f8);
      oVar25 = ParseMoney(&local_98.original);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.original._M_dataplus._M_p != paVar23) {
        operator_delete(local_98.original._M_dataplus._M_p,
                        local_98.original.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != (undefined1  [8])&local_1e8) {
        operator_delete((void *)local_1f8,local_1e8.__align + 1);
      }
      if (local_d8 != (undefined1  [8])local_c8) {
        operator_delete((void *)local_d8,local_c8._0_8_ + 1);
      }
      if (((undefined1  [16])
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_d8 = (undefined1  [8])local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"consolidatefeerate","");
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"-consolidatefeerate","");
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        ArgsManager::GetArg((string *)local_1f8,pAVar27,&local_f8,&local_118);
        common::AmountErrMsg(&local_98,(string *)local_d8,(string *)local_1f8);
        goto LAB_00c08fbc;
      }
      ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_consolidate_feerate).nSatoshisPerK =
           oVar25.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
    }
    if ((chain != (Chain *)0x0) &&
       (iVar8 = (*chain->_vptr_Chain[0x1e])(), 1000000 < CONCAT44(extraout_var_01,iVar8))) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"-minrelaytxfee","");
      common::AmountHighWarn(&local_518,&local_f8);
      local_538[0] = local_528;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_538," ","");
      original_04._M_string_length = (size_type)error;
      original_04._M_dataplus._M_p = (pointer)pAVar27;
      original_04.field_2._M_allocated_capacity = (size_type)this;
      original_04.field_2._8_8_ = chain;
      Untranslated((bilingual_str *)local_d8,original_04);
      lhs_09.original._M_string_length = (size_type)error;
      lhs_09.original._M_dataplus._M_p = (pointer)pAVar27;
      lhs_09.original.field_2._M_allocated_capacity = (size_type)this;
      lhs_09.original.field_2._8_8_ = chain;
      lhs_09.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
      lhs_09.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
      lhs_09.translated._M_string_length._4_4_ = uVar20;
      lhs_09.translated.field_2._M_allocated_capacity = lVar11;
      lhs_09.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
      lhs_09.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
      operator+(&local_4d8,lhs_09,&local_518);
      _((bilingual_str *)local_1f8,(ConstevalStringLiteral)0x10e787a);
      lhs_10.original._M_string_length = (size_type)error;
      lhs_10.original._M_dataplus._M_p = (pointer)pAVar27;
      lhs_10.original.field_2._M_allocated_capacity = (size_type)this;
      lhs_10.original.field_2._8_8_ = chain;
      lhs_10.translated._M_dataplus._M_p = (pointer)wallet_creation_flags;
      lhs_10.translated._M_string_length._0_4_ = in_stack_fffffffffffffa80;
      lhs_10.translated._M_string_length._4_4_ = uVar20;
      lhs_10.translated.field_2._M_allocated_capacity = lVar11;
      lhs_10.translated.field_2._8_4_ = in_stack_fffffffffffffa90;
      lhs_10.translated.field_2._12_4_ = in_stack_fffffffffffffa94;
      operator+(&local_98,lhs_10,&local_4d8);
      std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                (warnings,&local_98);
      bilingual_str::~bilingual_str(&local_98);
      bilingual_str::~bilingual_str((bilingual_str *)local_1f8);
      bilingual_str::~bilingual_str(&local_4d8);
      bilingual_str::~bilingual_str((bilingual_str *)local_d8);
      this_01 = pAVar27;
      if (local_538[0] != local_528) {
        operator_delete(local_538[0],local_528[0] + 1);
        this_01 = pAVar27;
      }
      bilingual_str::~bilingual_str(&local_518);
      pAVar27 = this_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
    }
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-txconfirmtarget","");
    iVar16 = ArgsManager::GetIntArg(this_01,&local_98.original,6);
    (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_confirm_target = (uint)iVar16;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-spendzeroconfchange","");
    bVar6 = ArgsManager::GetBoolArg(this_01,&local_98.original,true);
    (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    m_spend_zero_conf_change = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-walletrbf","");
    bVar6 = ArgsManager::GetBoolArg(this_01,&local_98.original,true);
    (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_signal_rbf
         = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    peVar3 = local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar17 = std::chrono::_V2::steady_clock::now();
    local_98.original._M_dataplus._M_p = (pointer)((lVar17 - lVar11) / 1000000);
    WalletLogPrintf<long>(peVar3,(ConstevalFormatString<1U>)0x10e78b8,(long *)&local_98);
    TopUpKeyPool(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
    ;
    GetAllScriptPubKeyMans
              ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)&local_98,
               local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    rescan_required = (undefined1)uVar20;
    psVar1 = &local_98.original._M_string_length;
    if ((size_type *)local_98.original.field_2._8_8_ == psVar1) {
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&local_98);
    }
    else {
      bVar6 = false;
      uVar13 = local_98.original.field_2._8_8_;
      do {
        pAVar18 = (ArgsManager *)(**(code **)(**(long **)(uVar13 + 0x20) + 0x98))();
        if (!(bool)(bVar6 & (long)this_01 <= (long)pAVar18)) {
          bVar6 = true;
          this_01 = pAVar18;
        }
        uVar13 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar13);
        rescan_required = (undefined1)uVar20;
      } while ((size_type *)uVar13 != psVar1);
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&local_98);
      if ((bVar6) &&
         ((long)this_01 <
          ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_birth_time).super___atomic_base<long>._M_i)) {
        LOCK();
        ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        m_birth_time).super___atomic_base<long>._M_i = (__int_type_conflict3)this_01;
        UNLOCK();
      }
    }
    paVar23 = &local_98.original.field_2;
    if ((chain != (Chain *)0x0) &&
       (bVar6 = AttachChain(&local_558,chain,(bool)rescan_required,error,
                            (vector<bilingual_str,_std::allocator<bilingual_str>_> *)args_1), !bVar6
       )) {
      pHVar2 = ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               m_chain_notifications_handler)._M_t.
               super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>
               ._M_t.
               super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>
               .super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
      ((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      m_chain_notifications_handler)._M_t.
      super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
      super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
      super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl = (Handler *)0x0;
      _Var21._M_pi = extraout_RDX_04;
      if (pHVar2 != (Handler *)0x0) {
        (*pHVar2->_vptr_Handler[1])();
        _Var21._M_pi = extraout_RDX_06;
      }
      goto LAB_00c09b28;
    }
    local_d8 = (undefined1  [8])
               &(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                cs_wallet;
    local_d0[0] = false;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_d8);
    peVar3 = local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98.original._M_dataplus._M_p = (pointer)paVar23;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"-walletbroadcast","");
    bVar6 = ArgsManager::GetBoolArg(pAVar27,&local_98.original,true);
    peVar3->fBroadcastTransactions = bVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
    }
    peVar3 = local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar9 = GetKeyPoolSize(local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
    local_98.original._M_dataplus._M_p._0_4_ = uVar9;
    WalletLogPrintf<unsigned_int>(peVar3,(ConstevalFormatString<1U>)0x10e78dc,(uint *)&local_98);
    local_98.original._M_dataplus._M_p =
         (pointer)((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mapWallet)._M_h._M_element_count;
    WalletLogPrintf<unsigned_long>
              (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ConstevalFormatString<1U>)0x10e78f4,(unsigned_long *)&local_98);
    local_98.original._M_dataplus._M_p =
         (pointer)((local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    WalletLogPrintf<unsigned_long>
              (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ConstevalFormatString<1U>)0x10e790b,(unsigned_long *)&local_98);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_d8);
    _Var21._M_pi = local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_WalletStorage)._vptr_WalletStorage =
         (_func_int **)
         local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_Notifications)._vptr_Notifications = (_func_int **)_Var21._M_pi;
    _Var21._M_pi = extraout_RDX_05;
    goto LAB_00c09b3f;
  case TOO_NEW:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Error loading %s: Wallet requires newer version of %s","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),"Error loading %s: Wallet requires newer version of %s"
                 ,"");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e725b;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<std::__cxx11::string,char[13]>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bitcoin Core",
               (char (*) [13])args_1);
    break;
  case UNKNOWN_DESCRIPTOR:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,
               "Unrecognized descriptor found. Loading wallet %s\n\nThe wallet might had been created on a newer version.\nPlease try running the latest software version.\n"
               ,"");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),
                 "Unrecognized descriptor found. Loading wallet %s\n\nThe wallet might had been created on a newer version.\nPlease try running the latest software version.\n"
                 ,"");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e7379;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  default:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Error loading %s","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),"Error loading %s","");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e74a5;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  case UNEXPECTED_LEGACY_ENTRY:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,
               "Unexpected legacy entry in descriptor wallet found. Loading wallet %s\n\nThe wallet might have been tampered with or created with malicious intent.\n"
               ,"");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),
                 "Unexpected legacy entry in descriptor wallet found. Loading wallet %s\n\nThe wallet might have been tampered with or created with malicious intent.\n"
                 ,"");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e7412;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    break;
  case CORRUPT:
    local_d8 = (undefined1  [8])local_c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Error loading %s: Wallet corrupted","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_c8._16_8_ = &local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_c8 + 0x10),"Error loading %s: Wallet corrupted","");
    }
    else {
      local_1f8 = (undefined1  [8])0x10e71c7;
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_c8 + 0x10),(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_1f8);
    }
    tinyformat::format<std::__cxx11::string>
              (&local_98,(tinyformat *)local_d8,(bilingual_str *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_98.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_98.translated);
    _Var21._M_pi = extraout_RDX_24;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
      operator_delete(local_98.translated._M_dataplus._M_p,
                      local_98.translated.field_2._M_allocated_capacity + 1);
      _Var21._M_pi = extraout_RDX_25;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.original._M_dataplus._M_p != paVar23) {
      operator_delete(local_98.original._M_dataplus._M_p,
                      local_98.original.field_2._M_allocated_capacity + 1);
      _Var21._M_pi = extraout_RDX_26;
    }
    _Var24._M_p = (pointer)local_c8._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._16_8_ != &local_a8) goto LAB_00c09b03;
    goto LAB_00c09b0b;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&error->original,&local_98.original);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&error->translated,&local_98.translated);
  _Var21._M_pi = extraout_RDX_27;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.translated._M_dataplus._M_p != &local_98.translated.field_2) {
    operator_delete(local_98.translated._M_dataplus._M_p,
                    local_98.translated.field_2._M_allocated_capacity + 1);
    _Var21._M_pi = extraout_RDX_28;
  }
  _Var24._M_p = local_98.original._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.original._M_dataplus._M_p != paVar23) {
LAB_00c09ae2:
    operator_delete(_Var24._M_p,
                    (ulong)((long)&((__pthread_internal_list *)
                                   local_98.original.field_2._M_allocated_capacity)->__prev + 1));
    _Var21._M_pi = extraout_RDX_29;
  }
LAB_00c09aea:
  _Var24._M_p = (pointer)local_c8._16_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._16_8_ != &local_a8) {
LAB_00c09b03:
    operator_delete(_Var24._M_p,
                    (ulong)((long)&((__pthread_internal_list *)local_a8._M_allocated_capacity)->
                                   __prev + 1));
    _Var21._M_pi = extraout_RDX_30;
  }
LAB_00c09b0b:
  if (local_d8 != (undefined1  [8])local_c8) {
    operator_delete((void *)local_d8,local_c8._0_8_ + 1);
    _Var21._M_pi = extraout_RDX_31;
  }
LAB_00c09b28:
  (this->super_WalletStorage)._vptr_WalletStorage = (_func_int **)0x0;
  (this->super_Notifications)._vptr_Notifications = (_func_int **)0x0;
LAB_00c09b30:
  if (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_558.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var21._M_pi = extraout_RDX_32;
  }
LAB_00c09b3f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58[0]._M_p != &local_48) {
    operator_delete(local_58[0]._M_p,local_48._M_allocated_capacity + 1);
    _Var21._M_pi = extraout_RDX_33;
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
    sVar26.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var21._M_pi;
    sVar26.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<wallet::CWallet>)
           sVar26.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_00c0abcc:
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<CWallet> CWallet::Create(WalletContext& context, const std::string& name, std::unique_ptr<WalletDatabase> database, uint64_t wallet_creation_flags, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    interfaces::Chain* chain = context.chain;
    ArgsManager& args = *Assert(context.args);
    const std::string& walletFile = database->Filename();

    const auto start{SteadyClock::now()};
    // TODO: Can't use std::make_shared because we need a custom deleter but
    // should be possible to use std::allocate_shared.
    std::shared_ptr<CWallet> walletInstance(new CWallet(chain, name, std::move(database)), FlushAndDeleteWallet);
    walletInstance->m_keypool_size = std::max(args.GetIntArg("-keypool", DEFAULT_KEYPOOL_SIZE), int64_t{1});
    walletInstance->m_notify_tx_changed_script = args.GetArg("-walletnotify", "");

    // Load wallet
    bool rescan_required = false;
    DBErrors nLoadWalletRet = walletInstance->LoadWallet();
    if (nLoadWalletRet != DBErrors::LOAD_OK) {
        if (nLoadWalletRet == DBErrors::CORRUPT) {
            error = strprintf(_("Error loading %s: Wallet corrupted"), walletFile);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::NONCRITICAL_ERROR)
        {
            warnings.push_back(strprintf(_("Error reading %s! All keys read correctly, but transaction data"
                                           " or address metadata may be missing or incorrect."),
                walletFile));
        }
        else if (nLoadWalletRet == DBErrors::TOO_NEW) {
            error = strprintf(_("Error loading %s: Wallet requires newer version of %s"), walletFile, PACKAGE_NAME);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED) {
            error = strprintf(_("Error loading %s: External signer wallet being loaded without external signer support compiled"), walletFile);
            return nullptr;
        }
        else if (nLoadWalletRet == DBErrors::NEED_REWRITE)
        {
            error = strprintf(_("Wallet needed to be rewritten: restart %s to complete"), PACKAGE_NAME);
            return nullptr;
        } else if (nLoadWalletRet == DBErrors::NEED_RESCAN) {
            warnings.push_back(strprintf(_("Error reading %s! Transaction data may be missing or incorrect."
                                           " Rescanning wallet."), walletFile));
            rescan_required = true;
        } else if (nLoadWalletRet == DBErrors::UNKNOWN_DESCRIPTOR) {
            error = strprintf(_("Unrecognized descriptor found. Loading wallet %s\n\n"
                                "The wallet might had been created on a newer version.\n"
                                "Please try running the latest software version.\n"), walletFile);
            return nullptr;
        } else if (nLoadWalletRet == DBErrors::UNEXPECTED_LEGACY_ENTRY) {
            error = strprintf(_("Unexpected legacy entry in descriptor wallet found. Loading wallet %s\n\n"
                                "The wallet might have been tampered with or created with malicious intent.\n"), walletFile);
            return nullptr;
        } else {
            error = strprintf(_("Error loading %s"), walletFile);
            return nullptr;
        }
    }

    // This wallet is in its first run if there are no ScriptPubKeyMans and it isn't blank or no privkeys
    const bool fFirstRun = walletInstance->m_spk_managers.empty() &&
                     !walletInstance->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS) &&
                     !walletInstance->IsWalletFlagSet(WALLET_FLAG_BLANK_WALLET);
    if (fFirstRun)
    {
        // ensure this wallet.dat can only be opened by clients supporting HD with chain split and expects no default key
        walletInstance->SetMinVersion(FEATURE_LATEST);

        walletInstance->InitWalletFlags(wallet_creation_flags);

        // Only create LegacyScriptPubKeyMan when not descriptor wallet
        if (!walletInstance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
            walletInstance->SetupLegacyScriptPubKeyMan();
        }

        if ((wallet_creation_flags & WALLET_FLAG_EXTERNAL_SIGNER) || !(wallet_creation_flags & (WALLET_FLAG_DISABLE_PRIVATE_KEYS | WALLET_FLAG_BLANK_WALLET))) {
            LOCK(walletInstance->cs_wallet);
            if (walletInstance->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                walletInstance->SetupDescriptorScriptPubKeyMans();
                // SetupDescriptorScriptPubKeyMans already calls SetupGeneration for us so we don't need to call SetupGeneration separately
            } else {
                // Legacy wallets need SetupGeneration here.
                for (auto spk_man : walletInstance->GetActiveScriptPubKeyMans()) {
                    if (!spk_man->SetupGeneration()) {
                        error = _("Unable to generate initial keys");
                        return nullptr;
                    }
                }
            }
        }

        if (chain) {
            walletInstance->chainStateFlushed(ChainstateRole::NORMAL, chain->getTipLocator());
        }
    } else if (wallet_creation_flags & WALLET_FLAG_DISABLE_PRIVATE_KEYS) {
        // Make it impossible to disable private keys after creation
        error = strprintf(_("Error loading %s: Private keys can only be disabled during creation"), walletFile);
        return nullptr;
    } else if (walletInstance->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        for (auto spk_man : walletInstance->GetActiveScriptPubKeyMans()) {
            if (spk_man->HavePrivateKeys()) {
                warnings.push_back(strprintf(_("Warning: Private keys detected in wallet {%s} with disabled private keys"), walletFile));
                break;
            }
        }
    }

    if (!args.GetArg("-addresstype", "").empty()) {
        std::optional<OutputType> parsed = ParseOutputType(args.GetArg("-addresstype", ""));
        if (!parsed) {
            error = strprintf(_("Unknown address type '%s'"), args.GetArg("-addresstype", ""));
            return nullptr;
        }
        walletInstance->m_default_address_type = parsed.value();
    }

    if (!args.GetArg("-changetype", "").empty()) {
        std::optional<OutputType> parsed = ParseOutputType(args.GetArg("-changetype", ""));
        if (!parsed) {
            error = strprintf(_("Unknown change type '%s'"), args.GetArg("-changetype", ""));
            return nullptr;
        }
        walletInstance->m_default_change_type = parsed.value();
    }

    if (args.IsArgSet("-mintxfee")) {
        std::optional<CAmount> min_tx_fee = ParseMoney(args.GetArg("-mintxfee", ""));
        if (!min_tx_fee) {
            error = AmountErrMsg("mintxfee", args.GetArg("-mintxfee", ""));
            return nullptr;
        } else if (min_tx_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-mintxfee") + Untranslated(" ") +
                               _("This is the minimum transaction fee you pay on every transaction."));
        }

        walletInstance->m_min_fee = CFeeRate{min_tx_fee.value()};
    }

    if (args.IsArgSet("-maxapsfee")) {
        const std::string max_aps_fee{args.GetArg("-maxapsfee", "")};
        if (max_aps_fee == "-1") {
            walletInstance->m_max_aps_fee = -1;
        } else if (std::optional<CAmount> max_fee = ParseMoney(max_aps_fee)) {
            if (max_fee.value() > HIGH_APS_FEE) {
                warnings.push_back(AmountHighWarn("-maxapsfee") + Untranslated(" ") +
                                  _("This is the maximum transaction fee you pay (in addition to the normal fee) to prioritize partial spend avoidance over regular coin selection."));
            }
            walletInstance->m_max_aps_fee = max_fee.value();
        } else {
            error = AmountErrMsg("maxapsfee", max_aps_fee);
            return nullptr;
        }
    }

    if (args.IsArgSet("-fallbackfee")) {
        std::optional<CAmount> fallback_fee = ParseMoney(args.GetArg("-fallbackfee", ""));
        if (!fallback_fee) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s'"), "-fallbackfee", args.GetArg("-fallbackfee", ""));
            return nullptr;
        } else if (fallback_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-fallbackfee") + Untranslated(" ") +
                               _("This is the transaction fee you may pay when fee estimates are not available."));
        }
        walletInstance->m_fallback_fee = CFeeRate{fallback_fee.value()};
    }

    // Disable fallback fee in case value was set to 0, enable if non-null value
    walletInstance->m_allow_fallback_fee = walletInstance->m_fallback_fee.GetFeePerK() != 0;

    if (args.IsArgSet("-discardfee")) {
        std::optional<CAmount> discard_fee = ParseMoney(args.GetArg("-discardfee", ""));
        if (!discard_fee) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s'"), "-discardfee", args.GetArg("-discardfee", ""));
            return nullptr;
        } else if (discard_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-discardfee") + Untranslated(" ") +
                               _("This is the transaction fee you may discard if change is smaller than dust at this level"));
        }
        walletInstance->m_discard_rate = CFeeRate{discard_fee.value()};
    }

    if (args.IsArgSet("-paytxfee")) {
        std::optional<CAmount> pay_tx_fee = ParseMoney(args.GetArg("-paytxfee", ""));
        if (!pay_tx_fee) {
            error = AmountErrMsg("paytxfee", args.GetArg("-paytxfee", ""));
            return nullptr;
        } else if (pay_tx_fee.value() > HIGH_TX_FEE_PER_KB) {
            warnings.push_back(AmountHighWarn("-paytxfee") + Untranslated(" ") +
                               _("This is the transaction fee you will pay if you send a transaction."));
        }

        walletInstance->m_pay_tx_fee = CFeeRate{pay_tx_fee.value(), 1000};

        if (chain && walletInstance->m_pay_tx_fee < chain->relayMinFee()) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s' (must be at least %s)"),
                "-paytxfee", args.GetArg("-paytxfee", ""), chain->relayMinFee().ToString());
            return nullptr;
        }
    }

    if (args.IsArgSet("-maxtxfee")) {
        std::optional<CAmount> max_fee = ParseMoney(args.GetArg("-maxtxfee", ""));
        if (!max_fee) {
            error = AmountErrMsg("maxtxfee", args.GetArg("-maxtxfee", ""));
            return nullptr;
        } else if (max_fee.value() > HIGH_MAX_TX_FEE) {
            warnings.push_back(strprintf(_("%s is set very high! Fees this large could be paid on a single transaction."), "-maxtxfee"));
        }

        if (chain && CFeeRate{max_fee.value(), 1000} < chain->relayMinFee()) {
            error = strprintf(_("Invalid amount for %s=<amount>: '%s' (must be at least the minrelay fee of %s to prevent stuck transactions)"),
                "-maxtxfee", args.GetArg("-maxtxfee", ""), chain->relayMinFee().ToString());
            return nullptr;
        }

        walletInstance->m_default_max_tx_fee = max_fee.value();
    }

    if (args.IsArgSet("-consolidatefeerate")) {
        if (std::optional<CAmount> consolidate_feerate = ParseMoney(args.GetArg("-consolidatefeerate", ""))) {
            walletInstance->m_consolidate_feerate = CFeeRate(*consolidate_feerate);
        } else {
            error = AmountErrMsg("consolidatefeerate", args.GetArg("-consolidatefeerate", ""));
            return nullptr;
        }
    }

    if (chain && chain->relayMinFee().GetFeePerK() > HIGH_TX_FEE_PER_KB) {
        warnings.push_back(AmountHighWarn("-minrelaytxfee") + Untranslated(" ") +
                           _("The wallet will avoid paying less than the minimum relay fee."));
    }

    walletInstance->m_confirm_target = args.GetIntArg("-txconfirmtarget", DEFAULT_TX_CONFIRM_TARGET);
    walletInstance->m_spend_zero_conf_change = args.GetBoolArg("-spendzeroconfchange", DEFAULT_SPEND_ZEROCONF_CHANGE);
    walletInstance->m_signal_rbf = args.GetBoolArg("-walletrbf", DEFAULT_WALLET_RBF);

    walletInstance->WalletLogPrintf("Wallet completed loading in %15dms\n", Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));

    // Try to top up keypool. No-op if the wallet is locked.
    walletInstance->TopUpKeyPool();

    // Cache the first key time
    std::optional<int64_t> time_first_key;
    for (auto spk_man : walletInstance->GetAllScriptPubKeyMans()) {
        int64_t time = spk_man->GetTimeFirstKey();
        if (!time_first_key || time < *time_first_key) time_first_key = time;
    }
    if (time_first_key) walletInstance->MaybeUpdateBirthTime(*time_first_key);

    if (chain && !AttachChain(walletInstance, *chain, rescan_required, error, warnings)) {
        walletInstance->m_chain_notifications_handler.reset(); // Reset this pointer so that the wallet will actually be unloaded
        return nullptr;
    }

    {
        LOCK(walletInstance->cs_wallet);
        walletInstance->SetBroadcastTransactions(args.GetBoolArg("-walletbroadcast", DEFAULT_WALLETBROADCAST));
        walletInstance->WalletLogPrintf("setKeyPool.size() = %u\n",      walletInstance->GetKeyPoolSize());
        walletInstance->WalletLogPrintf("mapWallet.size() = %u\n",       walletInstance->mapWallet.size());
        walletInstance->WalletLogPrintf("m_address_book.size() = %u\n",  walletInstance->m_address_book.size());
    }

    return walletInstance;
}